

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O3

bool __thiscall
ZAP::Archive::getData(Archive *this,Entry *entry,char **return_data,size_t *return_size)

{
  bool bVar1;
  char *data;
  char *local_38;
  
  if ((((entry == (Entry *)0x0) ||
       (bVar1 = supportsCompression((uint)(this->header).compression), !bVar1)) ||
      (entry->compressed_size == 0)) || (entry->decompressed_size == 0)) {
    return false;
  }
  std::istream::seekg(this->stream,entry->index,0);
  local_38 = (char *)operator_new__((ulong)entry->compressed_size);
  std::istream::read((char *)this->stream,(long)local_38);
  bVar1 = decompress((uint)(this->header).compression,&local_38,entry->compressed_size,
                     entry->decompressed_size);
  if (bVar1) {
    *return_data = local_38;
    *return_size = (ulong)entry->decompressed_size;
    return bVar1;
  }
  if (local_38 == (char *)0x0) {
    return bVar1;
  }
  operator_delete__(local_38);
  return bVar1;
}

Assistant:

bool Archive::getData(const Entry *entry, char *&return_data, std::size_t &return_size) const
	{
		if (entry == nullptr || !isSupportedCompression())
			return false;

		if (entry->compressed_size == 0 || entry->decompressed_size == 0)
			return false;

		stream->seekg(entry->index);

		char *data = new char[entry->compressed_size];
		stream->read(data, entry->compressed_size);

		if (!decompress(getCompression(), data, entry->compressed_size, entry->decompressed_size))
		{
			delete[] data;
			return false;
		}

		return_data = data;
		return_size = entry->decompressed_size;
		return true;
	}